

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O1

Particle * __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
          (Particle *__return_storage_ptr__,
          BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *this,PositionType minPosition,
          PositionType maxPosition)

{
  FP FVar1;
  FP FVar2;
  FP FVar3;
  FP FVar4;
  FP FVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  
  FVar1 = BaseFixture::urand(&this->super_BaseFixture,minPosition.x,maxPosition.x);
  FVar2 = BaseFixture::urand(&this->super_BaseFixture,-10.0,10.0);
  FVar3 = BaseFixture::urand(&this->super_BaseFixture,-10.0,10.0);
  FVar4 = BaseFixture::urand(&this->super_BaseFixture,-10.0,10.0);
  FVar5 = BaseFixture::urand(&this->super_BaseFixture,1e-05,100000.0);
  (__return_storage_ptr__->position).x = FVar1;
  (__return_storage_ptr__->p).x = 0.0;
  (__return_storage_ptr__->p).y = 0.0;
  (__return_storage_ptr__->p).z = 0.0;
  __return_storage_ptr__->factor = FVar5;
  __return_storage_ptr__->typeIndex = 0;
  dVar6 = *pica::ParticleTypes::types * 29979245800.0;
  dVar9 = FVar4 / dVar6;
  auVar7._8_8_ = FVar3;
  auVar7._0_8_ = FVar2;
  auVar8._8_8_ = dVar6;
  auVar8._0_8_ = dVar6;
  auVar8 = divpd(auVar7,auVar8);
  (__return_storage_ptr__->p).x = (double)auVar8._0_8_;
  (__return_storage_ptr__->p).y = (double)auVar8._8_8_;
  (__return_storage_ptr__->p).z = dVar9;
  dVar6 = dVar9 * dVar9 + auVar8._0_8_ * auVar8._0_8_ + auVar8._8_8_ * auVar8._8_8_ + 1.0;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  __return_storage_ptr__->invGamma = 1.0 / dVar6;
  return __return_storage_ptr__;
}

Assistant:

Particle randomParticle(PositionType minPosition, PositionType maxPosition)
    {
        PositionType position;
        for (int d = 0; d < dimension; d++)
            position[d] = urand(minPosition[d], maxPosition[d]);
        Real minMomentum = -10;
        Real maxMomentum = 10;
        MomentumType momentum(urand(minMomentum, maxMomentum),
            urand(minMomentum, maxMomentum), urand(minMomentum, maxMomentum));
        FactorType factor = static_cast<FactorType>(urand(1e-5, 1e5));
        return Particle(position, momentum, factor, 0);
    }